

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bech32_c_api_tests.c
# Opt level: O2

void decode_c1_longExample_isSuccessful(void)

{
  bech32_error bVar1;
  int iVar2;
  bech32_DecodedResult *decodedResult;
  char bstr [46];
  char local_48 [56];
  
  builtin_strncpy(local_48 + 0x20,"e6mua7lmqqqxw",0xe);
  builtin_strncpy(local_48 + 0x10,"f2tvdw0s3jn54khc",0x10);
  builtin_strncpy(local_48,"abcdef1qpzry9x8g",0x10);
  decodedResult = bech32_create_DecodedResult(local_48);
  bVar1 = bech32_decode(decodedResult,local_48);
  if (bVar1 != E_BECH32_SUCCESS) {
    __assert_fail("bech32_decode(decodedResult, bstr) == E_BECH32_SUCCESS",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/dcdpr[P]libbech32/test/testbech32/bech32_c_api_tests.c"
                  ,0x182,"void decode_c1_longExample_isSuccessful(void)");
  }
  iVar2 = strcmp(decodedResult->hrp,"abcdef");
  if (iVar2 != 0) {
    __assert_fail("strcmp(decodedResult->hrp, expectedHrp) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/dcdpr[P]libbech32/test/testbech32/bech32_c_api_tests.c"
                  ,0x183,"void decode_c1_longExample_isSuccessful(void)");
  }
  if (*decodedResult->dp != '\0') {
    __assert_fail("decodedResult->dp[0] == \'\\0\'",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/dcdpr[P]libbech32/test/testbech32/bech32_c_api_tests.c"
                  ,0x184,"void decode_c1_longExample_isSuccessful(void)");
  }
  if (decodedResult->dp[0x1f] == '\x1f') {
    if (decodedResult->encoding == ENCODING_BECH32) {
      bech32_free_DecodedResult(decodedResult);
      return;
    }
    __assert_fail("ENCODING_BECH32 == decodedResult->encoding",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/dcdpr[P]libbech32/test/testbech32/bech32_c_api_tests.c"
                  ,0x186,"void decode_c1_longExample_isSuccessful(void)");
  }
  __assert_fail("decodedResult->dp[31] == \'\\x1f\'",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/dcdpr[P]libbech32/test/testbech32/bech32_c_api_tests.c"
                ,0x185,"void decode_c1_longExample_isSuccessful(void)");
}

Assistant:

void decode_c1_longExample_isSuccessful(void) {
    char bstr[] = "abcdef1qpzry9x8gf2tvdw0s3jn54khce6mua7lmqqqxw";
    char expectedHrp[] = "abcdef";

    bech32_DecodedResult * decodedResult = bech32_create_DecodedResult(bstr);

    assert(bech32_decode(decodedResult, bstr) == E_BECH32_SUCCESS);
    assert(strcmp(decodedResult->hrp, expectedHrp) == 0);
    assert(decodedResult->dp[0] == '\0');    // first 'q' in above dp part
    assert(decodedResult->dp[31] == '\x1f'); // last 'l' in above dp part
    assert(ENCODING_BECH32 == decodedResult->encoding);

    bech32_free_DecodedResult(decodedResult);
}